

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DImporter.cpp
# Opt level: O2

aiNode * __thiscall Assimp::M3DImporter::findNode(M3DImporter *this,aiNode *pNode,aiString *name)

{
  bool bVar1;
  aiNode *paVar2;
  ulong __n;
  ulong uVar3;
  aiString local_434;
  
  if (pNode == (aiNode *)0x0) {
    __assert_fail("pNode != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x27a,"aiNode *Assimp::M3DImporter::findNode(aiNode *, aiString)");
  }
  if (this->mScene != (aiScene *)0x0) {
    bVar1 = aiString::operator==(&pNode->mName,name);
    paVar2 = pNode;
    if (!bVar1) {
      uVar3 = 0;
      do {
        if (pNode->mNumChildren <= uVar3) {
          return (aiNode *)0x0;
        }
        paVar2 = pNode->mChildren[uVar3];
        local_434.length = name->length;
        if (0x3fe < name->length) {
          local_434.length = 0x3ff;
        }
        __n = (ulong)local_434.length;
        memcpy(local_434.data,name->data,__n);
        local_434.data[__n] = '\0';
        paVar2 = findNode(this,paVar2,&local_434);
        uVar3 = uVar3 + 1;
      } while (paVar2 == (aiNode *)0x0);
    }
    return paVar2;
  }
  __assert_fail("mScene != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                ,0x27b,"aiNode *Assimp::M3DImporter::findNode(aiNode *, aiString)");
}

Assistant:

aiNode *M3DImporter::findNode(aiNode *pNode, aiString name) {
	unsigned int i;

	ai_assert(pNode != nullptr);
	ai_assert(mScene != nullptr);

	if (pNode->mName == name)
		return pNode;
	for (i = 0; i < pNode->mNumChildren; i++) {
		aiNode *pChild = findNode(pNode->mChildren[i], name);
		if (pChild) return pChild;
	}
	return nullptr;
}